

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Bool prvTidyFixXmlDecl(TidyDocImpl *doc)

{
  Node *element;
  ulong uVar1;
  Node *node;
  AttVal *pAVar2;
  AttVal *pAVar3;
  ctmbstr value;
  
  node = (doc->root).content;
  if ((node == (Node *)0x0) || (node->type != XmlDecl)) {
    node = prvTidyNewNode(doc->lexer->allocator,doc->lexer);
    node->type = XmlDecl;
    element = (doc->root).content;
    if (element == (Node *)0x0) {
      (doc->root).content = node;
    }
    else {
      prvTidyInsertNodeBeforeElement(element,node);
    }
  }
  pAVar2 = prvTidyGetAttrByName(node,"version");
  pAVar3 = prvTidyGetAttrByName(node,"encoding");
  if ((pAVar3 == (AttVal *)0x0) && (uVar1 = (doc->config).value[0x3c].v, uVar1 != 4)) {
    value = prvTidyGetEncodingNameFromTidyId((uint)uVar1);
    if (value != (ctmbstr)0x0) {
      prvTidyAddAttribute(doc,node,"encoding",value);
    }
  }
  if (pAVar2 == (AttVal *)0x0) {
    prvTidyAddAttribute(doc,node,"version","1.0");
  }
  return yes;
}

Assistant:

Bool TY_(FixXmlDecl)( TidyDocImpl* doc )
{
    Node* xml;
    AttVal *version, *encoding;
    Lexer*lexer = doc->lexer;
    Node* root = &doc->root;

    if ( root->content && root->content->type == XmlDecl )
    {
        xml = root->content;
    }
    else
    {
        xml = TY_(NewNode)(lexer->allocator, lexer);
        xml->type = XmlDecl;
        if ( root->content )
            TY_(InsertNodeBeforeElement)(root->content, xml);
        else
            root->content = xml;
    }

    version = TY_(GetAttrByName)(xml, "version");
    encoding = TY_(GetAttrByName)(xml, "encoding");

    /*
      We need to insert a check if declared encoding 
      and output encoding mismatch and fix the XML
      declaration accordingly!!!
    */

    if ( encoding == NULL && cfg(doc, TidyOutCharEncoding) != UTF8 )
    {
        ctmbstr enc = TY_(GetEncodingNameFromTidyId)(cfg(doc, TidyOutCharEncoding));
        if ( enc )
            TY_(AddAttribute)( doc, xml, "encoding", enc );
    }

    if ( version == NULL )
        TY_(AddAttribute)( doc, xml, "version", "1.0" );
    return yes;
}